

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

Result __thiscall
Inferences::SimplifyingGeneratingLiteralSimplification::simplify
          (SimplifyingGeneratingLiteralSimplification *this,Clause *cl_,bool doOrderingCheck)

{
  Literal *pLVar1;
  Literal *pLVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Clause *pCVar5;
  ulong uVar6;
  undefined1 extraout_DL;
  undefined7 in_register_00000011;
  ulong uVar7;
  uint uVar8;
  byte bVar9;
  bool bVar11;
  undefined8 unaff_R15;
  bool bVar12;
  Result RVar13;
  Stack<Kernel::Literal_*> out;
  Stack<Kernel::Literal_*> local_a8;
  SimplifyingGeneratingLiteralSimplification *local_88;
  undefined4 local_7c;
  undefined8 local_78;
  SimplifyingInference1 local_70;
  Inference local_60;
  byte bVar10;
  
  local_7c = (undefined4)CONCAT71(in_register_00000011,doOrderingCheck);
  local_a8._capacity = *(ulong *)&cl_->field_0x38 & 0xfffff;
  local_88 = this;
  if (local_a8._capacity == 0) {
    local_a8._stack = (Literal **)0x0;
  }
  else {
    uVar8 = (int)local_a8._capacity * 8 + 0xfU & 0xfffffff0;
    if (uVar8 == 0) {
      local_a8._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar8 < 0x11) {
      local_a8._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar8 < 0x19) {
      local_a8._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar8 < 0x21) {
      local_a8._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar8 < 0x31) {
      local_a8._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar8 < 0x41) {
      local_a8._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_a8._stack = (Literal **)::operator_new((ulong)uVar8,0x10);
    }
  }
  local_a8._end = local_a8._stack + local_a8._capacity;
  bVar11 = (*(ulong *)&cl_->field_0x38 & 0xfffff) == 0;
  bVar12 = !bVar11;
  local_a8._cursor = local_a8._stack;
  if (bVar11) {
    uVar8 = 0;
    bVar11 = true;
  }
  else {
    bVar3 = 1;
    uVar7 = 0;
    bVar10 = 0;
    bVar9 = 0;
    local_78 = 0;
    do {
      pLVar1 = cl_->_literals[uVar7];
      uVar8 = (*(local_88->super_SimplifyingGeneratingInference1).
                super_SimplifyingGeneratingInference.super_InferenceEngine._vptr_InferenceEngine[8])
                        (local_88,pLVar1);
      local_70.rule = (InferenceRule)uVar8;
      local_70._1_7_ = SUB87(CONCAT44(extraout_var,uVar8) >> 8,0);
      local_70.premise._0_1_ = extraout_DL;
      if (((uVar8 & 1) == 0) && ((Literal *)CONCAT17(extraout_DL,local_70._1_7_) == pLVar1)) {
        if (local_a8._cursor == local_a8._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_a8);
        }
        *local_a8._cursor = pLVar1;
        local_a8._cursor = local_a8._cursor + 1;
        uVar6 = 1;
      }
      else {
        pLVar2 = (Literal *)CONCAT17(extraout_DL,local_70._1_7_);
        *(int *)(DAT_00b7e1c0 + 400) = *(int *)(DAT_00b7e1c0 + 400) + 1;
        if ((uVar8 & 1) == 0) {
          if (local_a8._cursor == local_a8._end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(&local_a8);
          }
          *local_a8._cursor = pLVar2;
          local_a8._cursor = local_a8._cursor + 1;
          if ((char)local_7c != '\0') {
            iVar4 = (*local_88->_ordering->_vptr_Ordering[2])(local_88->_ordering,pLVar2,pLVar1);
            if (iVar4 == 1) {
              *(int *)(DAT_00b7e1c0 + 0x18c) = *(int *)(DAT_00b7e1c0 + 0x18c) + 1;
LAB_004fd374:
              bVar3 = 0;
            }
            else if (iVar4 == 2) {
              local_78 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar4) >> 8),1);
            }
            else if (iVar4 == 4) {
              *(int *)(DAT_00b7e1c0 + 0x188) = *(int *)(DAT_00b7e1c0 + 0x188) + 1;
              goto LAB_004fd374;
            }
          }
          uVar6 = 1;
          bVar9 = 1;
          bVar10 = 1;
        }
        else {
          bVar9 = bVar10;
          if ((uVar8 & 0x100) == 0) {
            bVar9 = 1;
          }
          uVar6 = ((ulong)pLVar2 ^ 1) & 0xffffffff;
          bVar10 = bVar9;
        }
      }
      if ((uVar6 & 1) == 0) break;
      uVar7 = uVar7 + 1;
      bVar12 = uVar7 < ((uint)*(undefined8 *)&cl_->field_0x38 & 0xfffff);
    } while (bVar12);
    uVar8 = (uint)(bVar3 & (byte)local_78);
    bVar11 = (bool)(bVar9 ^ 1);
  }
  uVar7 = CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar12);
  pCVar5 = (Clause *)0x0;
  if ((bVar12 == false) && (pCVar5 = cl_, !bVar11)) {
    local_70.rule = local_88->_rule;
    local_70.premise._0_1_ = SUB81(cl_,0);
    local_70.premise._1_7_ = (undefined7)((ulong)cl_ >> 8);
    Kernel::Inference::Inference(&local_60,&local_70);
    pCVar5 = Kernel::Clause::fromStack(&local_a8,&local_60);
    uVar7 = (ulong)uVar8;
  }
  if (local_a8._stack != (Literal **)0x0) {
    uVar6 = local_a8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._stack;
    }
    else if (uVar6 < 0x11) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._stack;
    }
    else if (uVar6 < 0x19) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._stack;
    }
    else if (uVar6 < 0x21) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._stack;
    }
    else if (uVar6 < 0x31) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._stack;
    }
    else if (uVar6 < 0x41) {
      *local_a8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._stack;
    }
    else {
      operator_delete(local_a8._stack,0x10);
    }
  }
  RVar13._8_8_ = uVar7 & 0xffffffff;
  RVar13.simplified = pCVar5;
  return RVar13;
}

Assistant:

SimplifyingGeneratingInference1::Result SimplifyingGeneratingLiteralSimplification::simplify(Clause* cl_, bool doOrderingCheck) {
  DEBUG("in:  ", *cl_)
  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;
  bool allLessEq = true;
  bool oneLess = false;

  for (unsigned i = 0; i < cl.size(); i++) {

    auto orig = cl[i];
    auto result = simplifyLiteral(orig);

    if (result.isLiteral() && result.unwrapLiteral() == orig ) {
      out.push(orig);
    } else {
      auto simpl = result;
      env.statistics->evaluationCnt++;

      if (simpl.isConstant()) {

        bool trivialValue = simpl.unwrapConstant();
        if (trivialValue) {
          /* clause is a tautology and can be deleted */
          return SimplifyingGeneratingInference1::Result::tautology();
        } else {
          /* do not add the literal to the output stack */
          changed = true;
        }

      } else {

        Literal* simplLit = simpl.unwrapLiteral();
        ASS_NEQ(simplLit, orig)
        changed = true;
        out.push(simplLit);

        if (doOrderingCheck) {
          ASS(_ordering)
          auto cmp = _ordering->compare(simplLit, orig);
          switch(cmp) {
            case Ordering::Result::LESS:
              oneLess = true;
              break;
            case Ordering::Result::EQUAL:
              ASSERTION_VIOLATION
              break;
            case Ordering::Result::INCOMPARABLE:
            case Ordering::Result::GREATER:
              if (cmp == Ordering::Result::INCOMPARABLE) {
                env.statistics->evaluationIncomp++;
              } else {
                env.statistics->evaluationGreater++;
              }
              DEBUG("ordering violated: ", cmp)
              DEBUG("orig: ", *orig)
              DEBUG("simp: ", *simplLit)
              allLessEq = false;
              break;
          }
        }
      }
    }
  }


  if (!changed) {
    return SimplifyingGeneratingInference1::Result::nop(cl_);
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(_rule, cl_));
    DEBUG("out: ", *result)
    return SimplifyingGeneratingInference1::Result{
            .simplified = result, 
            .premiseRedundant = allLessEq && oneLess,
          };
  }
}